

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O3

cbtCollisionObject * __thiscall
cbtCollisionWorldImporter::createCollisionObject
          (cbtCollisionWorldImporter *this,cbtTransform *startTransform,cbtCollisionShape *shape,
          char *bodyName)

{
  cbtCollisionObject **ptr;
  size_type sVar1;
  uint uVar2;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 this_00;
  cbtCollisionObject **ppcVar3;
  ulong uVar4;
  int iVar5;
  cbtCollisionObject *colObj;
  char *newname;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_68;
  anon_union_8_2_511b660c_for_cbtHashPtr_0 local_60 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char *local_38;
  
  this_00.m_pointer = cbtAlignedAllocInternal(0x178,0x10);
  cbtCollisionObject::cbtCollisionObject((cbtCollisionObject *)this_00.m_pointer);
  *(int *)((long)this_00.m_pointer + 0x160) = *(int *)((long)this_00.m_pointer + 0x160) + 1;
  sVar1 = *(size_type *)((startTransform->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(((cbtTransform *)((long)this_00.m_pointer + 8))->m_basis).m_el[0].m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[0].m_floats;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)this_00.m_pointer + 0x10))->_M_allocated_capacity = sVar1;
  sVar1 = *(size_type *)((startTransform->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)((cbtVector3 *)((long)this_00.m_pointer + 0x18))->m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[1].m_floats;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)this_00.m_pointer + 0x20))->_M_allocated_capacity = sVar1;
  sVar1 = *(size_type *)((startTransform->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)((cbtVector3 *)((long)this_00.m_pointer + 0x28))->m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[2].m_floats;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)this_00.m_pointer + 0x30))->_M_allocated_capacity = sVar1;
  sVar1 = *(size_type *)((startTransform->m_origin).m_floats + 2);
  *(undefined8 *)((cbtVector3 *)((long)this_00.m_pointer + 0x38))->m_floats =
       *(undefined8 *)(startTransform->m_origin).m_floats;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)this_00.m_pointer + 0x40))->_M_allocated_capacity = sVar1;
  local_68.m_pointer = this_00.m_pointer;
  (**(code **)(*this_00.m_pointer + 0x10))(this_00.m_pointer,shape);
  (*this->m_collisionWorld->_vptr_cbtCollisionWorld[9])
            (this->m_collisionWorld,this_00.m_pointer,1,0xffffffff);
  if (bodyName != (char *)0x0) {
    local_38 = duplicateName(this,bodyName);
    local_60[0].m_pointer = this_00.m_pointer;
    cbtHashMap<cbtHashPtr,_const_char_*>::insert
              (&this->m_objectNameMap,(cbtHashPtr *)local_60,&local_38);
    cbtHashString::cbtHashString((cbtHashString *)local_60,local_38);
    cbtHashMap<cbtHashString,_cbtCollisionObject_*>::insert
              (&this->m_nameColObjMap,(cbtHashString *)local_60,
               (cbtCollisionObject **)&local_68.m_pointer);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60[0].m_pointer != &local_50) {
      operator_delete(local_60[0].m_pointer,local_50._M_allocated_capacity + 1);
    }
  }
  uVar2 = (this->m_allocatedCollisionObjects).m_size;
  if (uVar2 == (this->m_allocatedCollisionObjects).m_capacity) {
    iVar5 = 1;
    if (uVar2 != 0) {
      iVar5 = uVar2 * 2;
    }
    if ((int)uVar2 < iVar5) {
      if (iVar5 == 0) {
        ppcVar3 = (cbtCollisionObject **)0x0;
      }
      else {
        ppcVar3 = (cbtCollisionObject **)cbtAlignedAllocInternal((long)iVar5 << 3,0x10);
        uVar2 = (this->m_allocatedCollisionObjects).m_size;
      }
      if (0 < (int)uVar2) {
        uVar4 = 0;
        do {
          ppcVar3[uVar4] = (this->m_allocatedCollisionObjects).m_data[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      ptr = (this->m_allocatedCollisionObjects).m_data;
      if ((ptr != (cbtCollisionObject **)0x0) &&
         ((this->m_allocatedCollisionObjects).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr);
        uVar2 = (this->m_allocatedCollisionObjects).m_size;
      }
      (this->m_allocatedCollisionObjects).m_ownsMemory = true;
      (this->m_allocatedCollisionObjects).m_data = ppcVar3;
      (this->m_allocatedCollisionObjects).m_capacity = iVar5;
    }
  }
  ((anon_union_8_2_511b660c_for_cbtHashPtr_0 *)
  ((this->m_allocatedCollisionObjects).m_data + (int)uVar2))->m_pointer = (void *)local_68;
  (this->m_allocatedCollisionObjects).m_size = uVar2 + 1;
  return (cbtCollisionObject *)local_68.m_pointer;
}

Assistant:

cbtCollisionObject* cbtCollisionWorldImporter::createCollisionObject(const cbtTransform& startTransform, cbtCollisionShape* shape, const char* bodyName)
{
	cbtCollisionObject* colObj = new cbtCollisionObject();
	colObj->setWorldTransform(startTransform);
	colObj->setCollisionShape(shape);
	m_collisionWorld->addCollisionObject(colObj);  //todo: flags etc

	if (bodyName)
	{
		char* newname = duplicateName(bodyName);
		m_objectNameMap.insert(colObj, newname);
		m_nameColObjMap.insert(newname, colObj);
	}
	m_allocatedCollisionObjects.push_back(colObj);

	return colObj;
}